

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::parseLatency(Parser *this)

{
  ulong uVar1;
  Module *pMVar2;
  CodeLocation errorPos;
  CodeLocation local_98;
  Value local_88;
  CompileMessage local_48;
  
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x29b542);
  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>::
  expect<char_const*>((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                       *)this,"latency");
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x275da6);
  local_98.sourceCode.object =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if (local_98.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_98.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_98.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_98.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  parseInt32Value(&local_88,this);
  uVar1 = soul::Value::getAsInt64(&local_88);
  soul::Value::~Value(&local_88);
  expectSemicolon(this);
  if (uVar1 < 0xea601) {
    pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
    pMVar2->latency = (uint32_t)uVar1;
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_98.sourceCode);
    return;
  }
  Errors::latencyOutOfRange<>();
  CodeLocation::throwError(&local_98,&local_48);
}

Assistant:

void parseLatency()
    {
        expect (HEARTOperator::dot);
        expect ("latency");
        expect (HEARTOperator::assign);
        auto errorPos = location;
        auto latency = parseInt32Value().getAsInt64();
        expectSemicolon();

        if (latency < 0 || latency > AST::maxInternalLatency)
            errorPos.throwError (Errors::latencyOutOfRange());

        module->latency = static_cast<uint32_t> (latency);
    }